

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

RPCHelpMan * joinpsbts(void)

{
  string name;
  string name_00;
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_01;
  string description_02;
  RPCMethodImpl fun;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_00;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  undefined8 in_stack_fffffffffffff9c8;
  RPCArgOptions *pRVar1;
  undefined8 in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9d8;
  undefined8 in_stack_fffffffffffff9e0;
  _Manager_type in_stack_fffffffffffff9e8;
  undefined8 in_stack_fffffffffffff9f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff9f8;
  pointer in_stack_fffffffffffffa08;
  pointer pRVar2;
  pointer in_stack_fffffffffffffa10;
  pointer pRVar3;
  pointer in_stack_fffffffffffffa18;
  pointer pRVar4;
  _Vector_impl_data in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa38 [16];
  pointer in_stack_fffffffffffffa48;
  pointer in_stack_fffffffffffffa50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa68 [16];
  pointer in_stack_fffffffffffffa78;
  undefined1 auVar5 [32];
  undefined1 in_stack_fffffffffffffa80 [48];
  undefined1 in_stack_fffffffffffffab0 [24];
  string local_538;
  char *local_518;
  size_type local_510;
  char local_508 [8];
  undefined8 uStack_500;
  string local_4f8 [32];
  string local_4d8 [32];
  RPCResult local_4b8;
  RPCArgOptions local_430;
  RPCArgOptions local_3e8;
  string local_3a0 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_380;
  undefined1 local_328;
  string local_320 [32];
  RPCArg local_300;
  string local_1f8 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1d8;
  undefined1 local_180;
  string local_178 [32];
  RPCArg local_158;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"joinpsbts",(allocator<char> *)&stack0xfffffffffffffa87);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,
             "\nJoins multiple distinct PSBTs with different inputs and outputs into one PSBT with inputs and outputs from all of the PSBTs\nNo input in any of the PSBTs can be in more than one of the PSBTs.\n"
             ,(allocator<char> *)&stack0xfffffffffffffa86);
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"txs",(allocator<char> *)&stack0xfffffffffffffa67);
  local_1d8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_180 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"The base64 strings of partially signed transactions",
             (allocator<char> *)&stack0xfffffffffffffa66);
  std::__cxx11::string::string<std::allocator<char>>
            (local_320,"psbt",(allocator<char> *)&stack0xfffffffffffffa47);
  local_380._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_328 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a0,"A base64 string of a PSBT",(allocator<char> *)&stack0xfffffffffffffa46);
  local_3e8.oneline_description._M_dataplus._M_p = (pointer)&local_3e8.oneline_description.field_2;
  local_3e8.skip_type_check = false;
  local_3e8.oneline_description._M_string_length = 0;
  local_3e8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_3e8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_3e8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_3e8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_3e8._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff9d0;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9c8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff9d8;
  name.field_2._8_8_ = in_stack_fffffffffffff9e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff9f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff9e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff9f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffffa08;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffffa10;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffffa18;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffffa20._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffffa20._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffffa20._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffffa38;
  description_01._M_string_length = (size_type)in_stack_fffffffffffffa50;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
  description_01.field_2 = in_stack_fffffffffffffa58;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffffa78;
  opts.skip_type_check = (bool)in_stack_fffffffffffffa68[0];
  opts._1_7_ = in_stack_fffffffffffffa68._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa68._8_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa80._0_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa80._16_24_;
  opts.hidden = (bool)in_stack_fffffffffffffa80[0x28];
  opts.also_positional = (bool)in_stack_fffffffffffffa80[0x29];
  opts._66_6_ = in_stack_fffffffffffffa80._42_6_;
  RPCArg::RPCArg(&local_300,name,(Type)local_320,fallback,description_01,opts);
  __l._M_len = 1;
  __l._M_array = &local_300;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffa48,__l,
             (allocator_type *)&stack0xfffffffffffffa45);
  local_430.oneline_description._M_dataplus._M_p = (pointer)&local_430.oneline_description.field_2;
  local_430.skip_type_check = false;
  local_430.oneline_description._M_string_length = 0;
  local_430.oneline_description.field_2._M_local_buf[0] = '\0';
  local_430.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_430.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_430.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_430.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_430._58_8_ = 0;
  pRVar1 = &local_430;
  name_00._M_string_length = in_stack_fffffffffffff9d0;
  name_00._M_dataplus._M_p = &pRVar1->skip_type_check;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff9d8;
  name_00.field_2._8_8_ = in_stack_fffffffffffff9e0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff9f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff9e8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff9f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffffa08;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffffa10;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffffa18;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffffa20._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffffa20._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffffa20._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffffa38;
  description_02._M_string_length = (size_type)in_stack_fffffffffffffa50;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
  description_02.field_2 = in_stack_fffffffffffffa58;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffffa78;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_fffffffffffffa68._0_8_;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffa68._8_8_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffab0._0_8_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffab0._8_8_;
  opts_00.hidden = (bool)in_stack_fffffffffffffab0[0x10];
  opts_00.also_positional = (bool)in_stack_fffffffffffffab0[0x11];
  opts_00._66_6_ = in_stack_fffffffffffffab0._18_6_;
  auVar5 = in_stack_fffffffffffffa80._8_32_;
  opts_00.skip_type_check = (bool)in_stack_fffffffffffffa80[0];
  opts_00._1_7_ = in_stack_fffffffffffffa80._1_7_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)auVar5._0_8_;
  opts_00.oneline_description._M_string_length = auVar5._8_8_;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar5._16_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa80._40_8_;
  RPCArg::RPCArg(&local_158,name_00,(Type)local_178,fallback_00,description_02,inner_00,opts_00);
  __l_00._M_len = 1;
  __l_00._M_array = &local_158;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffa68,__l_00,
             (allocator_type *)&stack0xfffffffffffffa44);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d8,"",(allocator<char> *)&stack0xfffffffffffffa27);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4f8,"The base64-encoded partially signed transaction",
             (allocator<char> *)&stack0xfffffffffffffa26);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff9d0;
  m_key_name._M_dataplus._M_p = &pRVar1->skip_type_check;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff9d8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff9e0;
  description._M_string_length = in_stack_fffffffffffff9f0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9e8;
  description.field_2 = in_stack_fffffffffffff9f8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_4b8,STR,m_key_name,description,inner,SUB81(local_4d8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9d0;
  result._0_8_ = pRVar1;
  result.m_key_name._M_string_length = in_stack_fffffffffffff9d8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff9e0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff9e8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff9f0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff9f8;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result._88_24_ = in_stack_fffffffffffffa20;
  result.m_cond._8_16_ = in_stack_fffffffffffffa38;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffffa48;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffa28,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffaa8,"joinpsbts",
             (allocator<char> *)&stack0xfffffffffffffa07);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffa88,"\"psbt\"",
             (allocator<char> *)&stack0xfffffffffffffa06);
  HelpExampleCli(&local_538,(string *)&stack0xfffffffffffffaa8,(string *)&stack0xfffffffffffffa88);
  local_518 = local_508;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p == &local_538.field_2) {
    uStack_500 = local_538.field_2._8_8_;
  }
  else {
    local_518 = local_538._M_dataplus._M_p;
  }
  local_510 = local_538._M_string_length;
  local_538._M_string_length = 0;
  local_538.field_2._M_local_buf[0] = '\0';
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:1738:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:1738:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffff9f8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffa48;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa38._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffffa38._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffa50;
  fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffa68._0_8_;
  fun._M_invoker = (_Invoker_type)in_stack_fffffffffffffa68._8_8_;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffffa58._M_local_buf;
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff9d0,&stack0xfffffffffffff9d8)),
             description_00,args,(RPCResults)in_stack_fffffffffffffa20,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff9d8);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffa88);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffaa8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffa28);
  RPCResult::~RPCResult(&local_4b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffa08);
  std::__cxx11::string::~string(local_4f8);
  std::__cxx11::string::~string(local_4d8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffa68);
  RPCArg::~RPCArg(&local_158);
  RPCArgOptions::~RPCArgOptions(&local_430);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffa48);
  RPCArg::~RPCArg(&local_300);
  RPCArgOptions::~RPCArgOptions(&local_3e8);
  std::__cxx11::string::~string(local_3a0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_380._M_first);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string(local_1f8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1d8._M_first);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan joinpsbts()
{
    return RPCHelpMan{"joinpsbts",
            "\nJoins multiple distinct PSBTs with different inputs and outputs into one PSBT with inputs and outputs from all of the PSBTs\n"
            "No input in any of the PSBTs can be in more than one of the PSBTs.\n",
            {
                {"txs", RPCArg::Type::ARR, RPCArg::Optional::NO, "The base64 strings of partially signed transactions",
                    {
                        {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "A base64 string of a PSBT"}
                    }}
            },
            RPCResult {
                    RPCResult::Type::STR, "", "The base64-encoded partially signed transaction"
            },
            RPCExamples {
                HelpExampleCli("joinpsbts", "\"psbt\"")
            },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    // Unserialize the transactions
    std::vector<PartiallySignedTransaction> psbtxs;
    UniValue txs = request.params[0].get_array();

    if (txs.size() <= 1) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "At least two PSBTs are required to join PSBTs.");
    }

    uint32_t best_version = 1;
    uint32_t best_locktime = 0xffffffff;
    for (unsigned int i = 0; i < txs.size(); ++i) {
        PartiallySignedTransaction psbtx;
        std::string error;
        if (!DecodeBase64PSBT(psbtx, txs[i].get_str(), error)) {
            throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
        }
        psbtxs.push_back(psbtx);
        // Choose the highest version number
        if (psbtx.tx->version > best_version) {
            best_version = psbtx.tx->version;
        }
        // Choose the lowest lock time
        if (psbtx.tx->nLockTime < best_locktime) {
            best_locktime = psbtx.tx->nLockTime;
        }
    }

    // Create a blank psbt where everything will be added
    PartiallySignedTransaction merged_psbt;
    merged_psbt.tx = CMutableTransaction();
    merged_psbt.tx->version = best_version;
    merged_psbt.tx->nLockTime = best_locktime;

    // Merge
    for (auto& psbt : psbtxs) {
        for (unsigned int i = 0; i < psbt.tx->vin.size(); ++i) {
            if (!merged_psbt.AddInput(psbt.tx->vin[i], psbt.inputs[i])) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Input %s:%d exists in multiple PSBTs", psbt.tx->vin[i].prevout.hash.ToString(), psbt.tx->vin[i].prevout.n));
            }
        }
        for (unsigned int i = 0; i < psbt.tx->vout.size(); ++i) {
            merged_psbt.AddOutput(psbt.tx->vout[i], psbt.outputs[i]);
        }
        for (auto& xpub_pair : psbt.m_xpubs) {
            if (merged_psbt.m_xpubs.count(xpub_pair.first) == 0) {
                merged_psbt.m_xpubs[xpub_pair.first] = xpub_pair.second;
            } else {
                merged_psbt.m_xpubs[xpub_pair.first].insert(xpub_pair.second.begin(), xpub_pair.second.end());
            }
        }
        merged_psbt.unknown.insert(psbt.unknown.begin(), psbt.unknown.end());
    }

    // Generate list of shuffled indices for shuffling inputs and outputs of the merged PSBT
    std::vector<int> input_indices(merged_psbt.inputs.size());
    std::iota(input_indices.begin(), input_indices.end(), 0);
    std::vector<int> output_indices(merged_psbt.outputs.size());
    std::iota(output_indices.begin(), output_indices.end(), 0);

    // Shuffle input and output indices lists
    std::shuffle(input_indices.begin(), input_indices.end(), FastRandomContext());
    std::shuffle(output_indices.begin(), output_indices.end(), FastRandomContext());

    PartiallySignedTransaction shuffled_psbt;
    shuffled_psbt.tx = CMutableTransaction();
    shuffled_psbt.tx->version = merged_psbt.tx->version;
    shuffled_psbt.tx->nLockTime = merged_psbt.tx->nLockTime;
    for (int i : input_indices) {
        shuffled_psbt.AddInput(merged_psbt.tx->vin[i], merged_psbt.inputs[i]);
    }
    for (int i : output_indices) {
        shuffled_psbt.AddOutput(merged_psbt.tx->vout[i], merged_psbt.outputs[i]);
    }
    shuffled_psbt.unknown.insert(merged_psbt.unknown.begin(), merged_psbt.unknown.end());

    DataStream ssTx{};
    ssTx << shuffled_psbt;
    return EncodeBase64(ssTx);
},
    };
}